

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall asmjit::Zone::Zone(Zone *this,uint32_t blockSize,uint32_t blockAlignment)

{
  uint32_t blockAlignment_local;
  uint32_t blockSize_local;
  Zone *this_local;
  uint32_t local_4;
  
  this->_ptr = (uint8_t *)0x0;
  this->_end = (uint8_t *)0x0;
  this->_block = (Block *)Zone_zeroBlock;
  this->_blockSize = blockSize;
  switch(blockAlignment) {
  case 0:
    local_4 = 0;
    break;
  case 1:
    local_4 = 0;
    break;
  case 2:
    local_4 = 1;
    break;
  default:
    local_4 = 0;
    break;
  case 4:
    local_4 = 2;
    break;
  case 8:
    local_4 = 3;
    break;
  case 0x10:
    local_4 = 4;
    break;
  case 0x20:
    local_4 = 5;
    break;
  case 0x40:
    local_4 = 6;
  }
  this->_blockAlignmentShift = local_4;
  return;
}

Assistant:

Zone::Zone(uint32_t blockSize, uint32_t blockAlignment) noexcept
  : _ptr(nullptr),
    _end(nullptr),
    _block(const_cast<Zone::Block*>(&Zone_zeroBlock)),
    _blockSize(blockSize),
    _blockAlignmentShift(Zone_getAlignmentOffsetFromAlignment(blockAlignment)) {}